

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O3

void __thiscall UDMFParser::ParseLinedef(UDMFParser *this,line_t *ld,int index)

{
  DWORD *pDVar1;
  DWORD *pDVar2;
  byte *pbVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  char *__s1;
  DWORD DVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  long lVar10;
  ulong extraout_RAX_01;
  uint uVar11;
  uint uVar12;
  DWORD *pDVar13;
  FString *this_00;
  undefined1 auVar14 [16];
  FString tagstring;
  FString arg1str;
  FString arg0str;
  FName key;
  FString local_178;
  FString local_170;
  FString local_168;
  FString local_160;
  FName local_154;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  side_t **local_138;
  FScanner local_130;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 3;
  local_168.Chars = FString::NullString.Nothing;
  local_170.Chars = FString::NullString.Nothing;
  local_178.Chars = FString::NullString.Nothing;
  uVar11 = 0;
  memset(ld,0,0x98);
  ld->alpha = 1.0;
  ld->portalindex = 0xffffffff;
  ld->sidedef[0] = (side_t *)0x0;
  DVar6 = level.flags2;
  ld->sidedef[1] = (side_t *)0x0;
  if ((level.flags2 >> 9 & 1) != 0) {
    ld->flags = 0x80000;
    uVar11 = 0x80000;
  }
  if ((DVar6 >> 10 & 1) != 0) {
    uVar11 = uVar11 | 0x100000;
    ld->flags = uVar11;
  }
  if ((DVar6 >> 0xb & 1) != 0) {
    ld->flags = uVar11 | 0x400000;
  }
  FScanner::MustGetToken((FScanner *)this,0x7b);
  local_138 = ld->sidedef;
  pDVar1 = &ld->flags;
  pDVar2 = &ld->activation;
  local_140 = 0;
  local_148 = 0;
  local_150 = 0;
LAB_0057c42f:
  bVar7 = FScanner::CheckToken((FScanner *)this,0x7d);
  if (bVar7) {
    if (((FNullStringData *)(local_178.Chars + -0xc))->Len != 0) {
      FScanner::FScanner(&local_130);
      FString::AttachToOther(&local_160,&local_178);
      FScanner::OpenString(&local_130,"tagstring",&local_160);
      FString::~FString(&local_160);
      while (bVar7 = FScanner::CheckNumber(&local_130), bVar7) {
        if (local_130.Number != 0) {
          FTagManager::AddLineID(&tagManager,index,local_130.Number);
        }
      }
      FScanner::~FScanner(&local_130);
    }
    if (this->isTranslated == true) {
      uVar11 = ld->flags;
      local_130._10_4_ = 0;
      local_130.String._0_4_ = 0;
      local_130.String._4_2_ = 0;
      uVar4 = ld->special;
      uVar5 = ld->args[0];
      auVar14._4_4_ = uVar5;
      auVar14._0_4_ = uVar4;
      auVar14._8_8_ = 0;
      auVar14 = pshuflw(auVar14,auVar14,0xe8);
      local_130.String._6_2_ = auVar14._0_2_;
      local_130.StringLen._0_2_ = auVar14._2_2_;
      P_TranslateLineDef(ld,(maplinedef_t *)&local_130,-1);
      *pDVar1 = *pDVar1 & 0x802200 | uVar11;
    }
    if (((local_150 & 1) != 0) && ((*pDVar2 & 2) != 0)) {
      *pDVar2 = *pDVar2 & 0xffffffbd | 0x40;
    }
    if ((((local_148 & 1) != 0) && (ld->alpha == 1.0)) && (!NAN(ld->alpha))) {
      ld->alpha = 0.75;
    }
    if ((((local_140 & 1) != 0) && (ld->alpha == 65536.0)) && (!NAN(ld->alpha))) {
      ld->alpha = 0.25;
    }
    if (*local_138 == (side_t *)0x0) {
      *local_138 = (side_t *)0x1;
      Printf("Line %d has no first side.\n",(ulong)(uint)index);
    }
    if (((ulong)((FNullStringData *)(local_168.Chars + -0xc))->Len != 0) &&
       (((iVar8 = ld->special, iVar8 - 0x50U < 6 || (iVar8 == 0xe2)) || (iVar8 == 0)))) {
      iVar8 = FName::NameManager::FindName
                        (&FName::NameData,local_168.Chars,
                         (ulong)((FNullStringData *)(local_168.Chars + -0xc))->Len,false);
      ld->args[0] = -iVar8;
    }
    if ((ulong)((FNullStringData *)(local_170.Chars + -0xc))->Len != 0) {
      uVar11 = ld->special - 0x86;
      if (((uVar11 < 0x2d) && ((0x12000000002fU >> ((ulong)uVar11 & 0x3f) & 1) != 0)) ||
         (ld->special == 0)) {
        iVar8 = FName::NameManager::FindName
                          (&FName::NameData,local_170.Chars,
                           (ulong)((FNullStringData *)(local_170.Chars + -0xc))->Len,false);
        ld->args[1] = -iVar8;
      }
    }
    if ((*pDVar1 & 0x10200000) == 0x10000000) {
      Printf("Line %d has midtex3dimpassible without midtex3d.\n",(ulong)(uint)index);
    }
    FString::~FString(&local_178);
    FString::~FString(&local_170);
    FString::~FString(&local_168);
    return;
  }
  UDMFParserBase::ParseKey((UDMFParserBase *)&local_130,SUB81(this,0),(bool *)0x0);
  uVar11 = (uint)local_130.String;
  iVar8 = 1;
  pDVar13 = pDVar1;
  switch((uint)local_130.String) {
  case 0x14d:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0057c46f_caseD_14e;
    iVar8 = (this->super_UDMFParserBase).sc.TokenType;
    uVar11 = iVar8 - 0x14b;
    uVar9 = (ulong)uVar11;
    if (1 < uVar11) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Boolean value expected for key \'%s\'",
                 FName::NameData.NameArray[0x14d].Text);
      uVar9 = extraout_RAX;
    }
    local_148 = CONCAT71((int7)(uVar9 >> 8),iVar8 == 0x14b);
    goto LAB_0057c42f;
  case 0x14e:
  case 0x14f:
  case 0x150:
  case 0x151:
  case 0x152:
  case 0x153:
  case 0x154:
  case 0x155:
  case 0x156:
  case 0x157:
  case 0x158:
  case 0x162:
  case 0x163:
  case 0x164:
  case 0x165:
  case 0x168:
  case 0x169:
  case 0x16a:
  case 0x16b:
  case 0x16c:
    goto switchD_0057c46f_caseD_14e;
  case 0x159:
    lVar10 = 0x1590;
    break;
  case 0x15a:
    iVar8 = 2;
    lVar10 = 0x15a0;
    break;
  case 0x15b:
    iVar8 = 4;
    lVar10 = 0x15b0;
    break;
  case 0x15c:
    iVar8 = 8;
    lVar10 = 0x15c0;
    break;
  case 0x15d:
    iVar8 = 0x10;
    lVar10 = 0x15d0;
    break;
  case 0x15e:
    iVar8 = 0x20;
    lVar10 = 0x15e0;
    break;
  case 0x15f:
    iVar8 = 0x40;
    lVar10 = 0x15f0;
    break;
  case 0x160:
    iVar8 = 0x80;
    lVar10 = 0x1600;
    break;
  case 0x161:
    iVar8 = 0x100;
    lVar10 = 0x1610;
    break;
  case 0x166:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0057c46f_caseD_14e;
    iVar8 = 0x20000;
    lVar10 = 0x1660;
    break;
  case 0x167:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0057c46f_caseD_14e;
    iVar8 = 0x40000;
    lVar10 = 0x1670;
    break;
  case 0x16d:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0057c46f_caseD_14e;
    iVar8 = (this->super_UDMFParserBase).sc.TokenType;
    uVar11 = iVar8 - 0x14b;
    uVar9 = (ulong)uVar11;
    if (1 < uVar11) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Boolean value expected for key \'%s\'",
                 FName::NameData.NameArray[0x16d].Text);
      uVar9 = extraout_RAX_00;
    }
    local_140 = CONCAT71((int7)(uVar9 >> 8),iVar8 == 0x14b);
    goto LAB_0057c42f;
  case 0x16e:
    if (((this->super_UDMFParserBase).namespace_bits & 0x71) == 0) goto switchD_0057c46f_caseD_14e;
    iVar8 = (this->super_UDMFParserBase).sc.TokenType;
    uVar11 = iVar8 - 0x14b;
    uVar9 = (ulong)uVar11;
    if (1 < uVar11) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Boolean value expected for key \'%s\'",
                 FName::NameData.NameArray[0x16e].Text);
      uVar9 = extraout_RAX_01;
    }
    local_150 = CONCAT71((int7)(uVar9 >> 8),iVar8 == 0x14b);
    goto LAB_0057c42f;
  default:
    uVar12 = (uint)local_130.String - 0x10c;
    switch((ulong)uVar12) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[(uint)local_130.String].Text);
      }
      ld->args[uVar12] = (this->super_UDMFParserBase).sc.Number;
      goto LAB_0057c42f;
    case 5:
      if (((this->super_UDMFParserBase).namespace_bits & 0x10) != 0) {
        this_00 = &local_168;
        if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"String value expected for key \'%s\'",
                     FName::NameData.NameArray[0x111].Text);
          this_00 = &local_168;
        }
LAB_0057c935:
        FString::operator=(this_00,(this->super_UDMFParserBase).parsedString.Chars);
        goto LAB_0057c42f;
      }
      break;
    case 6:
      if (((this->super_UDMFParserBase).namespace_bits & 0x10) != 0) {
        this_00 = &local_170;
        if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"String value expected for key \'%s\'",
                     FName::NameData.NameArray[0x112].Text);
          this_00 = &local_170;
        }
        goto LAB_0057c935;
      }
      break;
    case 7:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x113].Text);
      }
      FTagManager::AddLineID(&tagManager,index,(this->super_UDMFParserBase).sc.Number);
      goto LAB_0057c42f;
    case 8:
      break;
    case 9:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x115].Text);
      }
      ld->v1 = (vertex_t *)(long)(this->super_UDMFParserBase).sc.Number;
      goto LAB_0057c42f;
    case 10:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x116].Text);
      }
      ld->v2 = (vertex_t *)(long)(this->super_UDMFParserBase).sc.Number;
      goto LAB_0057c42f;
    case 0xb:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x117].Text);
      }
      *local_138 = (side_t *)((long)(this->super_UDMFParserBase).sc.Number + 1);
      goto LAB_0057c42f;
    case 0xc:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x118].Text);
      }
      ld->sidedef[1] = (side_t *)((long)(this->super_UDMFParserBase).sc.Number + 1);
      goto LAB_0057c42f;
    default:
      if ((uint)local_130.String != 0xe6) break;
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0xe6].Text);
      }
      uVar11 = (this->super_UDMFParserBase).sc.Number;
      ld->special = uVar11;
      if (((this->super_UDMFParserBase).namespc.Index == 10) &&
         ((0x8c < uVar11 || ("\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar11] == '\0')))) {
        ld->special = 0;
      }
      goto LAB_0057c42f;
    }
switchD_0057c46f_caseD_14e:
    if (this->isTranslated == false) {
      switch((uint)local_130.String) {
      case 0x16f:
        iVar8 = 0x200;
        lVar10 = 0x16f0;
        break;
      default:
        goto switchD_0057c835_caseD_170;
      case 0x173:
        lVar10 = 0x1730;
        pDVar13 = pDVar2;
        break;
      case 0x174:
        iVar8 = 2;
        lVar10 = 0x1740;
        pDVar13 = pDVar2;
        break;
      case 0x175:
        iVar8 = 0x400;
        lVar10 = 0x1750;
        pDVar13 = pDVar2;
        break;
      case 0x176:
        iVar8 = 4;
        lVar10 = 0x1760;
        pDVar13 = pDVar2;
        break;
      case 0x177:
        iVar8 = 8;
        lVar10 = 6000;
        pDVar13 = pDVar2;
        break;
      case 0x178:
        iVar8 = 0x10;
        lVar10 = 0x1780;
        pDVar13 = pDVar2;
        break;
      case 0x179:
        iVar8 = 0x20;
        lVar10 = 0x1790;
        pDVar13 = pDVar2;
        break;
      case 0x17b:
        iVar8 = 0x100;
        lVar10 = 0x17b0;
        pDVar13 = pDVar2;
        break;
      case 0x17c:
        iVar8 = 0x200;
        lVar10 = 0x17c0;
        pDVar13 = pDVar2;
      }
      break;
    }
switchD_0057c835_caseD_170:
    uVar12 = (this->super_UDMFParserBase).namespace_bits;
    if ((uVar12 & 0x70) == 0) goto switchD_0057c80b_caseD_166;
    if ((int)(uint)local_130.String < 0x1ad) {
      switch((uint)local_130.String) {
      case 0x162:
        iVar8 = 0x2000;
        lVar10 = 0x1620;
        break;
      case 0x163:
        iVar8 = 0x4000;
        lVar10 = 0x1630;
        break;
      case 0x164:
        iVar8 = 0x8000;
        lVar10 = 0x1640;
        break;
      case 0x165:
        iVar8 = 0x10000;
        lVar10 = 0x1650;
        break;
      case 0x166:
      case 0x167:
      case 0x16d:
      case 0x16e:
      case 0x16f:
      case 0x170:
      case 0x173:
      case 0x174:
      case 0x175:
      case 0x176:
      case 0x177:
      case 0x178:
      case 0x179:
        goto switchD_0057c80b_caseD_166;
      case 0x168:
        iVar8 = 0x80000;
        lVar10 = 0x1680;
        break;
      case 0x169:
        iVar8 = 0x100000;
        lVar10 = 0x1690;
        break;
      case 0x16a:
        iVar8 = 0x200000;
        lVar10 = 0x16a0;
        break;
      case 0x16b:
        iVar8 = 0x400000;
        lVar10 = 0x16b0;
        break;
      case 0x16c:
        iVar8 = 0x800000;
        lVar10 = 0x16c0;
        break;
      case 0x171:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Integer value expected for key \'%s\'",
                     FName::NameData.NameArray[0x171].Text);
        }
        ld->locknumber = (this->super_UDMFParserBase).sc.Number;
        goto LAB_0057c42f;
      case 0x172:
        iVar8 = 0x10000000;
        lVar10 = 0x1720;
        break;
      case 0x17a:
        iVar8 = 0x80;
        lVar10 = 0x17a0;
        pDVar13 = pDVar2;
        break;
      default:
        if ((uint)local_130.String == 0xdf) {
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[0xdf].Text);
          }
          ld->alpha = (this->super_UDMFParserBase).sc.Float;
        }
        else {
          if ((uint)local_130.String == 0x114) {
            if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
              FScanner::ScriptMessage
                        ((FScanner *)this,"String value expected for key \'%s\'",
                         FName::NameData.NameArray[0x114].Text);
            }
            FString::operator=(&local_178,(this->super_UDMFParserBase).parsedString.Chars);
            uVar12 = (this->super_UDMFParserBase).namespace_bits;
          }
switchD_0057c80b_caseD_166:
          if (((uVar12 & 0x30) != 0) &&
             (iVar8 = strncasecmp("user_",FName::NameData.NameArray[(int)uVar11].Text,5), iVar8 == 0
             )) {
            local_154.Index = uVar11;
            AddUserKey(this,&local_154,0,index);
          }
        }
        goto LAB_0057c42f;
      }
    }
    else {
      switch((uint)local_130.String) {
      case 0x1ad:
        iVar8 = 0x1000000;
        lVar10 = 0x1ad0;
        break;
      case 0x1ae:
        iVar8 = 0x2000000;
        lVar10 = 0x1ae0;
        break;
      default:
        goto switchD_0057c80b_caseD_166;
      case 0x1b0:
        iVar8 = 0x4000000;
        lVar10 = 0x1b00;
        break;
      case 0x1b1:
        iVar8 = 0x8000000;
        lVar10 = 0x1b10;
        break;
      case 0x1b2:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"String value expected for key \'%s\'",
                     FName::NameData.NameArray[0x1b2].Text);
        }
        __s1 = (this->super_UDMFParserBase).parsedString.Chars;
        iVar8 = strcasecmp(__s1,"translucent");
        if (iVar8 == 0) {
          pbVar3 = (byte *)((long)&ld->flags + 1);
          *pbVar3 = *pbVar3 & 0xfb;
        }
        else {
          iVar8 = strcasecmp(__s1,"add");
          if (iVar8 == 0) {
            pbVar3 = (byte *)((long)&ld->flags + 1);
            *pbVar3 = *pbVar3 | 4;
          }
          else {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Unknown value \"%s\" for \'renderstyle\'\n",__s1);
          }
        }
        goto LAB_0057c42f;
      }
    }
  }
  UDMFParserBase::Flag<unsigned_int>
            (&this->super_UDMFParserBase,pDVar13,iVar8,
             *(char **)((long)&(FName::NameData.NameArray)->Text + lVar10));
  goto LAB_0057c42f;
}

Assistant:

void ParseLinedef(line_t *ld, int index)
	{
		bool passuse = false;
		bool strifetrans = false;
		bool strifetrans2 = false;
		FString arg0str, arg1str;
		int lineid = -1;	// forZDoomTranslated namespace
		FString tagstring;

		memset(ld, 0, sizeof(*ld));
		ld->alpha = 1.;
		ld->portalindex = UINT_MAX;
		ld->sidedef[0] = ld->sidedef[1] = NULL;
		if (level.flags2 & LEVEL2_CLIPMIDTEX) ld->flags |= ML_CLIP_MIDTEX;
		if (level.flags2 & LEVEL2_WRAPMIDTEX) ld->flags |= ML_WRAP_MIDTEX;
		if (level.flags2 & LEVEL2_CHECKSWITCHRANGE) ld->flags |= ML_CHECKSWITCHRANGE;

		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();

			// This switch contains all keys of the UDMF base spec
			switch(key)
			{
			case NAME_V1:
				ld->v1 = (vertex_t*)(intptr_t)CheckInt(key);	// must be relocated later
				continue;

			case NAME_V2:
				ld->v2 = (vertex_t*)(intptr_t)CheckInt(key);	// must be relocated later
				continue;

			case NAME_Special:
				ld->special = CheckInt(key);
				if (namespc == NAME_Hexen)
				{
					if (ld->special < 0 || ld->special > 140 || !HexenLineSpecialOk[ld->special])
						ld->special = 0;	// NULL all specials which don't exist in Hexen
				}

				continue;

			case NAME_Id:
				lineid = CheckInt(key);
				tagManager.AddLineID(index, lineid);
				continue;

			case NAME_Sidefront:
				ld->sidedef[0] = (side_t*)(intptr_t)(1 + CheckInt(key));
				continue;

			case NAME_Sideback:
				ld->sidedef[1] = (side_t*)(intptr_t)(1 + CheckInt(key));
				continue;

			case NAME_Arg0:
			case NAME_Arg1:
			case NAME_Arg2:
			case NAME_Arg3:
			case NAME_Arg4:
				ld->args[int(key)-int(NAME_Arg0)] = CheckInt(key);
				continue;

			case NAME_Arg0Str:
				CHECK_N(Zd);
				arg0str = CheckString(key);
				continue;

			case NAME_Arg1Str:
				CHECK_N(Zd);
				arg1str = CheckString(key);
				continue;

			case NAME_Blocking:
				Flag(ld->flags, ML_BLOCKING, key); 
				continue;

			case NAME_Blockmonsters:
				Flag(ld->flags, ML_BLOCKMONSTERS, key); 
				continue;

			case NAME_Twosided:
				Flag(ld->flags, ML_TWOSIDED, key); 
				continue;

			case NAME_Dontpegtop:
				Flag(ld->flags, ML_DONTPEGTOP, key); 
				continue;

			case NAME_Dontpegbottom:
				Flag(ld->flags, ML_DONTPEGBOTTOM, key); 
				continue;

			case NAME_Secret:
				Flag(ld->flags, ML_SECRET, key); 
				continue;

			case NAME_Blocksound:
				Flag(ld->flags, ML_SOUNDBLOCK, key); 
				continue;

			case NAME_Dontdraw:
				Flag(ld->flags, ML_DONTDRAW, key); 
				continue;

			case NAME_Mapped:
				Flag(ld->flags, ML_MAPPED, key); 
				continue;

			case NAME_Jumpover:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(ld->flags, ML_RAILING, key); 
				continue;

			case NAME_Blockfloaters:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(ld->flags, ML_BLOCK_FLOATERS, key); 
				continue;

			case NAME_Translucent:
				CHECK_N(St | Zd | Zdt | Va)
				strifetrans = CheckBool(key); 
				continue;

			case NAME_Transparent:
				CHECK_N(St | Zd | Zdt | Va)
				strifetrans2 = CheckBool(key); 
				continue;

			case NAME_Passuse:
				CHECK_N(Dm | Zd | Zdt | Va)
				passuse = CheckBool(key); 
				continue;

			default:
				break;
			}

			// This switch contains all keys of the UDMF base spec which only apply to Hexen format specials
			if (!isTranslated) switch (key)
			{
			case NAME_Playercross:
				Flag(ld->activation, SPAC_Cross, key); 
				continue;

			case NAME_Playeruse:
				Flag(ld->activation, SPAC_Use, key); 
				continue;

			case NAME_Playeruseback:
				Flag(ld->activation, SPAC_UseBack, key); 
				continue;

			case NAME_Monstercross:
				Flag(ld->activation, SPAC_MCross, key); 
				continue;

			case NAME_Impact:
				Flag(ld->activation, SPAC_Impact, key); 
				continue;

			case NAME_Playerpush:
				Flag(ld->activation, SPAC_Push, key); 
				continue;

			case NAME_Missilecross:
				Flag(ld->activation, SPAC_PCross, key); 
				continue;

			case NAME_Monsteruse:
				Flag(ld->activation, SPAC_MUse, key); 
				continue;

			case NAME_Monsterpush:
				Flag(ld->activation, SPAC_MPush, key); 
				continue;

			case NAME_Repeatspecial:
				Flag(ld->flags, ML_REPEAT_SPECIAL, key); 
				continue;

			default:
				break;
			}

			// This switch contains all keys which are ZDoom specific
			if (namespace_bits & (Zd|Zdt|Va)) switch(key)
			{
			case NAME_Alpha:
				ld->setAlpha(CheckFloat(key));
				continue;

			case NAME_Renderstyle:
			{
				const char *str = CheckString(key);
				if (!stricmp(str, "translucent")) ld->flags &= ~ML_ADDTRANS;
				else if (!stricmp(str, "add")) ld->flags |= ML_ADDTRANS;
				else sc.ScriptMessage("Unknown value \"%s\" for 'renderstyle'\n", str);
				continue;
			}

			case NAME_Anycross:
				Flag(ld->activation, SPAC_AnyCross, key); 
				continue;

			case NAME_Monsteractivate:
				Flag(ld->flags, ML_MONSTERSCANACTIVATE, key); 
				continue;

			case NAME_Blockplayers:
				Flag(ld->flags, ML_BLOCK_PLAYERS, key); 
				continue;

			case NAME_Blockeverything:
				Flag(ld->flags, ML_BLOCKEVERYTHING, key); 
				continue;

			case NAME_Zoneboundary:
				Flag(ld->flags, ML_ZONEBOUNDARY, key); 
				continue;

			case NAME_Clipmidtex:
				Flag(ld->flags, ML_CLIP_MIDTEX, key); 
				continue;

			case NAME_Wrapmidtex:
				Flag(ld->flags, ML_WRAP_MIDTEX, key); 
				continue;

			case NAME_Midtex3d:
				Flag(ld->flags, ML_3DMIDTEX, key); 
				continue;

			case NAME_Checkswitchrange:
				Flag(ld->flags, ML_CHECKSWITCHRANGE, key); 
				continue;

			case NAME_Firstsideonly:
				Flag(ld->flags, ML_FIRSTSIDEONLY, key); 
				continue;

			case NAME_blockprojectiles:
				Flag(ld->flags, ML_BLOCKPROJECTILE, key); 
				continue;

			case NAME_blockuse:
				Flag(ld->flags, ML_BLOCKUSE, key); 
				continue;

			case NAME_blocksight:
				Flag(ld->flags, ML_BLOCKSIGHT, key); 
				continue;
			
			case NAME_blockhitscan:
				Flag(ld->flags, ML_BLOCKHITSCAN, key); 
				continue;
			
			// [TP] Locks the special with a key
			case NAME_Locknumber:
				ld->locknumber = CheckInt(key);
				continue;

			// [TP] Causes a 3d midtex to behave like an impassible line
			case NAME_Midtex3dimpassible:
				Flag(ld->flags, ML_3DMIDTEX_IMPASS, key);
				continue;

			case NAME_MoreIds:
				// delay parsing of the tag string until parsing of the sector is complete
				// This ensures that the ID is always the first tag in the list.
				tagstring = CheckString(key);
				break;


			default:
				break;
			}


			if ((namespace_bits & (Zd | Zdt)) && !strnicmp("user_", key.GetChars(), 5))
			{
				AddUserKey(key, UDMF_Line, index);
			}
		}

		if (tagstring.IsNotEmpty())
		{
			FScanner sc;
			sc.OpenString("tagstring", tagstring);
			// scan the string as long as valid numbers can be found
			while (sc.CheckNumber())
			{
				if (sc.Number != 0)	tagManager.AddLineID(index, sc.Number);
			}
		}

		if (isTranslated)
		{
			int saved = ld->flags;

			maplinedef_t mld;
			memset(&mld, 0, sizeof(mld));
			mld.special = ld->special;
			mld.tag = ld->args[0];
			P_TranslateLineDef(ld, &mld);
			ld->flags = saved | (ld->flags&(ML_MONSTERSCANACTIVATE|ML_REPEAT_SPECIAL|ML_FIRSTSIDEONLY));
		}
		if (passuse && (ld->activation & SPAC_Use)) 
		{
			ld->activation = (ld->activation & ~SPAC_Use) | SPAC_UseThrough;
		}
		if (strifetrans && ld->alpha == 1.)
		{
			ld->alpha = 0.75;
		}
		if (strifetrans2 && ld->alpha == OPAQUE)
		{
			ld->alpha = 0.25;
		}
		if (ld->sidedef[0] == NULL)
		{
			ld->sidedef[0] = (side_t*)(intptr_t)(1);
			Printf("Line %d has no first side.\n", index);
		}
		if (arg0str.IsNotEmpty() && (P_IsACSSpecial(ld->special) || ld->special == 0))
		{
			ld->args[0] = -FName(arg0str);
		}
		if (arg1str.IsNotEmpty() && (P_IsThingSpecial(ld->special) || ld->special == 0))
		{
			ld->args[1] = -FName(arg1str);
		}
		if ((ld->flags & ML_3DMIDTEX_IMPASS) && !(ld->flags & ML_3DMIDTEX)) // [TP]
		{
			Printf ("Line %d has midtex3dimpassible without midtex3d.\n", index);
		}
	}